

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O1

void google::protobuf::compiler::php::GenerateField
               (FieldDescriptor *field,Printer *printer,bool is_descriptor)

{
  string *value1;
  FieldDescriptor *field_00;
  string local_48;
  
  if (*(int *)(field + 0x4c) == 3) {
    GenerateFieldDocComment(printer,field);
    io::Printer::Print(printer,"private $^name^;\n","name",*(string **)field);
  }
  else {
    if (*(long *)(field + 0x60) != 0) {
      return;
    }
    GenerateFieldDocComment(printer,field);
    value1 = *(string **)field;
    DefaultForField_abi_cxx11_(&local_48,(php *)field,field_00);
    io::Printer::Print(printer,"private $^name^ = ^default^;\n","name",value1,"default",&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  if (is_descriptor) {
    io::Printer::Print(printer,"private $has_^name^ = false;\n","name",*(string **)field);
  }
  return;
}

Assistant:

void GenerateField(const FieldDescriptor* field, io::Printer* printer,
                   bool is_descriptor) {
  if (field->is_repeated()) {
    GenerateFieldDocComment(printer, field);
    printer->Print(
        "private $^name^;\n",
        "name", field->name());
  } else if (field->containing_oneof()) {
    // Oneof fields are handled by GenerateOneofField.
    return;
  } else {
    GenerateFieldDocComment(printer, field);
    printer->Print(
        "private $^name^ = ^default^;\n",
        "name", field->name(),
        "default", DefaultForField(field));
  }

  if (is_descriptor) {
    printer->Print(
        "private $has_^name^ = false;\n",
        "name", field->name());
  }
}